

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O0

int Cec_ManLoadCounterExamples(Vec_Ptr_t *vInfo,Vec_Int_t *vCexStore,int iStart)

{
  int nWords_00;
  int iVar1;
  int Entry;
  Vec_Int_t *p;
  Vec_Ptr_t *vInfo_00;
  int *pLits;
  int local_44;
  int kMax;
  int nSize;
  int k;
  int nBits;
  int nWords;
  Vec_Ptr_t *vPres;
  Vec_Int_t *vPat;
  int iStart_local;
  Vec_Int_t *vCexStore_local;
  Vec_Ptr_t *vInfo_local;
  
  nWords_00 = Vec_PtrReadWordsSimInfo(vInfo);
  local_44 = 0;
  p = Vec_IntAlloc(100);
  iVar1 = Vec_PtrSize(vInfo);
  vInfo_00 = Vec_PtrAllocSimInfo(iVar1,nWords_00);
  Vec_PtrCleanSimInfo(vInfo_00,0,nWords_00);
  vPat._4_4_ = iStart;
  do {
    do {
      iVar1 = Vec_IntSize(vCexStore);
      if (iVar1 <= vPat._4_4_) goto LAB_007e9598;
      iVar1 = vPat._4_4_ + 1;
      vPat._4_4_ = vPat._4_4_ + 2;
      iVar1 = Vec_IntEntry(vCexStore,iVar1);
    } while (iVar1 < 1);
    Vec_IntClear(p);
    for (kMax = 0; kMax < iVar1; kMax = kMax + 1) {
      Entry = Vec_IntEntry(vCexStore,vPat._4_4_);
      Vec_IntPush(p,Entry);
      vPat._4_4_ = vPat._4_4_ + 1;
    }
    for (kMax = 1; kMax < nWords_00 * 0x20; kMax = kMax + 1) {
      pLits = Vec_IntArray(p);
      iVar1 = Vec_IntSize(p);
      iVar1 = Cec_ManLoadCounterExamplesTry(vInfo,vInfo_00,kMax,pLits,iVar1);
      if (iVar1 != 0) break;
    }
    local_44 = Abc_MaxInt(local_44,kMax);
  } while (kMax != nWords_00 * 0x20 + -1);
LAB_007e9598:
  Vec_PtrFree(vInfo_00);
  Vec_IntFree(p);
  return vPat._4_4_;
}

Assistant:

int Cec_ManLoadCounterExamples( Vec_Ptr_t * vInfo, Vec_Int_t * vCexStore, int iStart )
{ 
    Vec_Int_t * vPat;
    Vec_Ptr_t * vPres;
    int nWords = Vec_PtrReadWordsSimInfo(vInfo);
    int nBits = 32 * nWords; 
    int k, nSize, kMax = 0;//, iBit = 1;
    vPat  = Vec_IntAlloc( 100 );
    vPres = Vec_PtrAllocSimInfo( Vec_PtrSize(vInfo), nWords );
    Vec_PtrCleanSimInfo( vPres, 0, nWords );
    while ( iStart < Vec_IntSize(vCexStore) )
    {
        // skip the output number
        iStart++;
        // get the number of items
        nSize = Vec_IntEntry( vCexStore, iStart++ );
        if ( nSize <= 0 )
            continue;
        // extract pattern
        Vec_IntClear( vPat );
        for ( k = 0; k < nSize; k++ )
            Vec_IntPush( vPat, Vec_IntEntry( vCexStore, iStart++ ) );
        // add pattern to storage
        for ( k = 1; k < nBits; k++ )
            if ( Cec_ManLoadCounterExamplesTry( vInfo, vPres, k, (int *)Vec_IntArray(vPat), Vec_IntSize(vPat) ) )
                break;
        kMax = Abc_MaxInt( kMax, k );
        if ( k == nBits-1 )
            break;
    }
    Vec_PtrFree( vPres );
    Vec_IntFree( vPat );
    return iStart;
}